

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

QRect __thiscall
QItemDelegate::doCheck
          (QItemDelegate *this,QStyleOptionViewItem *option,QRect *bounding,QVariant *value)

{
  bool bVar1;
  QItemDelegatePrivate *this_00;
  QWidget *pQVar2;
  undefined8 *in_RDX;
  QStyleOptionViewItem *in_RSI;
  long in_FS_OFFSET;
  QRect QVar3;
  QStyle *style;
  QWidget *widget;
  QItemDelegatePrivate *d;
  QStyleOptionButton opt;
  QStyleOption *in_stack_ffffffffffffff18;
  QStyleOptionButton *in_stack_ffffffffffffff20;
  QStyle *local_d0;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 local_60;
  long local_8;
  
  QVar3._8_8_ = local_80;
  QVar3._0_8_ = local_88;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ::QVariant::isValid((QVariant *)in_stack_ffffffffffffff20);
  if (bVar1) {
    this_00 = d_func((QItemDelegate *)0x852077);
    memset(local_78,0xaa,0x70);
    QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)0x85209a);
    QStyleOption::operator=
              (&in_stack_ffffffffffffff20->super_QStyleOption,in_stack_ffffffffffffff18);
    local_68 = *in_RDX;
    local_60 = in_RDX[1];
    pQVar2 = QItemDelegatePrivate::widget(this_00,in_RSI);
    if (pQVar2 == (QWidget *)0x0) {
      local_d0 = QApplication::style();
    }
    else {
      local_d0 = QWidget::style((QWidget *)in_stack_ffffffffffffff18);
    }
    QVar3 = (QRect)(**(code **)(*(long *)local_d0 + 0xc0))(local_d0,0x17,local_78,pQVar2);
    QStyleOptionButton::~QStyleOptionButton(in_stack_ffffffffffffff20);
  }
  else {
    QRect::QRect((QRect *)in_stack_ffffffffffffff20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QRect QItemDelegate::doCheck(const QStyleOptionViewItem &option,
                           const QRect &bounding, const QVariant &value) const
{
    if (value.isValid()) {
        Q_D(const QItemDelegate);
        QStyleOptionButton opt;
        opt.QStyleOption::operator=(option);
        opt.rect = bounding;
        const QWidget *widget = d->widget(option); // cast
        QStyle *style = widget ? widget->style() : QApplication::style();
        return style->subElementRect(QStyle::SE_ItemViewItemCheckIndicator, &opt, widget);
    }
    return QRect();
}